

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<int,int>::
Flush<duckdb::BitpackingCompressionState<int,true,int>::BitpackingWriter>
          (BitpackingState<int,int> *this)

{
  BitpackingState<int,int> *result;
  BitpackingState<int,int> *values;
  int *piVar1;
  int iVar2;
  idx_t iVar3;
  int *values_00;
  bool bVar4;
  uint uVar5;
  BitpackingState<int,int> BVar6;
  unsigned_long uVar7;
  byte bVar8;
  byte bVar9;
  idx_t iVar10;
  byte bVar11;
  byte bVar12;
  bool bVar13;
  uint uVar14;
  ulong uVar15;
  
  bVar13 = true;
  if (*(idx_t *)(this + 0x4810) != 0) {
    if (((this[0x4845] == (BitpackingState<int,int>)0x0) &&
        (*(int *)(this + 0x482c) != *(int *)(this + 0x4828))) ||
       (1 < (byte)((char)this[0x4848] - 1U))) {
      result = this + 0x4830;
      BVar6 = (BitpackingState<int,int>)
              TrySubtractOperator::Operation<int,int,int>
                        (*(int32_t *)(this + 0x482c),*(int32_t *)(this + 0x4828),(int32_t *)result);
      this[0x4847] = BVar6;
      BitpackingState<int,_int>::CalculateDeltaStats((BitpackingState<int,_int> *)this);
      if (this[0x4846] == (BitpackingState<int,int>)0x1) {
        iVar2 = *(int *)(this + 0x4834);
        if ((*(int *)(this + 0x4838) == iVar2) && (((byte)this[0x4848] & 0xfe) != 4)) {
          BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteConstantDelta
                    (*(int *)(this + 0x4838),**(int **)(this + 0x2008),*(idx_t *)(this + 0x4810),
                     *(int **)(this + 0x2008),(bool *)(this + 0x4010),*(void **)(this + 0x4820));
          *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 0xc;
          return true;
        }
        uVar14 = *(uint *)(this + 0x483c);
        bVar11 = 0;
        bVar12 = bVar11;
        if (uVar14 != 0) {
          do {
            bVar11 = bVar11 + 1;
            bVar4 = 1 < uVar14;
            uVar14 = (int)uVar14 >> 1;
          } while (bVar4);
          bVar12 = 0x20;
          if (bVar11 < 0x1d) {
            bVar12 = bVar11;
          }
        }
        uVar14 = *(uint *)result;
        if (uVar14 == 0) {
          bVar9 = 0;
        }
        else {
          uVar5 = -uVar14;
          if (0 < (int)uVar14) {
            uVar5 = uVar14;
          }
          uVar15 = (ulong)uVar5;
          bVar11 = 0;
          do {
            bVar8 = bVar11;
            uVar15 = uVar15 >> 1;
            bVar11 = bVar8 + 1;
            bVar4 = 1 < uVar5;
            uVar5 = (uint)uVar15;
          } while (bVar4);
          bVar9 = 0x20;
          if (bVar11 < 0x1c) {
            bVar9 = bVar8 + 2;
          }
        }
        BVar6 = this[0x4848];
        if (BVar6 != (BitpackingState<int,int>)0x5 && bVar12 < bVar9) {
          values = this + 0x2010;
          iVar3 = *(idx_t *)(this + 0x4810);
          if (iVar3 != 0) {
            iVar10 = 0;
            do {
              *(int *)(values + iVar10 * 4) = *(int *)(values + iVar10 * 4) - iVar2;
              iVar10 = iVar10 + 1;
            } while (iVar3 != iVar10);
          }
          BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteDeltaFor
                    ((int *)values,(bool *)(this + 0x4010),bVar12,*(int *)(this + 0x4834),
                     *(int *)(this + 0x4840),*(int **)(this + 0x2008),iVar3,
                     *(void **)(this + 0x4820));
          *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 0x10;
          uVar15 = *(ulong *)(this + 0x4810);
          if ((uVar15 & 0x1f) != 0) {
            uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar15 & 0x1f);
            uVar15 = (uVar15 - uVar7) + 0x20;
          }
          *(ulong *)(this + 0x4818) = *(long *)(this + 0x4818) + (bVar12 * uVar15 >> 3);
          if (BVar6 != (BitpackingState<int,int>)0x5 && bVar12 < bVar9) {
            return true;
          }
        }
      }
      if (this[0x4847] == (BitpackingState<int,int>)0x1) {
        if (*(uint *)result == 0) {
          bVar12 = 0;
        }
        else {
          bVar11 = 0;
          uVar14 = *(uint *)result;
          do {
            bVar11 = bVar11 + 1;
            bVar4 = 1 < uVar14;
            uVar14 = (int)uVar14 >> 1;
          } while (bVar4);
          bVar12 = 0x20;
          if (bVar11 < 0x1d) {
            bVar12 = bVar11;
          }
        }
        values_00 = *(int **)(this + 0x2008);
        iVar3 = *(idx_t *)(this + 0x4810);
        if (iVar3 != 0) {
          iVar2 = *(int *)(this + 0x4828);
          iVar10 = 0;
          do {
            piVar1 = values_00 + iVar10;
            *piVar1 = *piVar1 - iVar2;
            iVar10 = iVar10 + 1;
          } while (iVar3 != iVar10);
        }
        BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteFor
                  (values_00,(bool *)(this + 0x4010),bVar12,*(int *)(this + 0x4828),iVar3,
                   *(void **)(this + 0x4820));
        uVar15 = *(ulong *)(this + 0x4810);
        if ((uVar15 & 0x1f) != 0) {
          uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar15 & 0x1f);
          uVar15 = (uVar15 - uVar7) + 0x20;
        }
        *(ulong *)(this + 0x4818) = *(long *)(this + 0x4818) + (bVar12 * uVar15 >> 3) + 0xc;
      }
      else {
        bVar13 = false;
      }
    }
    else {
      BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteConstant
                (*(int *)(this + 0x482c),*(idx_t *)(this + 0x4810),*(void **)(this + 0x4820),
                 (bool)this[0x4845]);
      *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 8;
    }
  }
  return bVar13;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}